

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

void __thiscall MetricsDiscovery::MDHelper::CloseStream(MDHelper *this)

{
  long in_RDI;
  TCompletionCode res;
  
  if ((((*(byte *)(in_RDI + 0x20) & 1) != 0) && (*(long *)(in_RDI + 0x48) != 0)) &&
     ((*(uint *)(in_RDI + 0x24) & 1) != 0)) {
    (**(code **)(**(long **)(in_RDI + 0x48) + 0x30))();
  }
  return;
}

Assistant:

void MDHelper::CloseStream()
{
    if( !m_Initialized || !m_ConcurrentGroup )
    {
        DebugPrint("Can't CloseStream!\n");
        return;
    }

    if( !( m_APIMask & API_TYPE_IOSTREAM ) )
    {
        DebugPrint("CloseStream requires API_TYPE_IOSTREAM!\n");
        return;
    }

    TCompletionCode res = m_ConcurrentGroup->CloseIoStream();
    if( res != CC_OK )
    {
        DebugPrint( "CloseStream failed: %d\n", res );
        return;
    }
}